

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

uint m68k_is_valid_instruction(uint instruction,uint cpu_type)

{
  uint uVar1;
  uint cpu_type_local;
  uint instruction_local;
  
  if (g_initialized == 0) {
    build_opcode_table();
    g_initialized = 1;
  }
  uVar1 = instruction & 0xffff;
  if (g_instruction_table[uVar1] == d68000_illegal) {
    return 0;
  }
  switch(cpu_type) {
  case 1:
    if (g_instruction_table[uVar1] == d68010_bkpt) {
      return 0;
    }
    if (g_instruction_table[uVar1] == d68010_move_fr_ccr) {
      return 0;
    }
    if (g_instruction_table[uVar1] == d68010_movec) {
      return 0;
    }
    if (g_instruction_table[uVar1] == d68010_moves_8) {
      return 0;
    }
    if (g_instruction_table[uVar1] == d68010_moves_16) {
      return 0;
    }
    if (g_instruction_table[uVar1] == d68010_moves_32) {
      return 0;
    }
    if (g_instruction_table[uVar1] == d68010_rtd) {
      return 0;
    }
    break;
  case 2:
    break;
  case 3:
  case 4:
  case 5:
  case 6:
    goto switchD_004eebac_caseD_3;
  case 7:
  case 8:
  case 9:
    goto switchD_004eebac_caseD_7;
  default:
    goto switchD_004eebac_default;
  }
  if (g_instruction_table[uVar1] == d68020_bcc_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_bfchg) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_bfclr) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_bfexts) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_bfextu) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_bfffo) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_bfins) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_bfset) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_bftst) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_bra_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_bsr_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_callm) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cas_8) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cas_16) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cas_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cas2_16) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cas2_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_chk_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_chk2_cmp2_8) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_chk2_cmp2_16) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_chk2_cmp2_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cmpi_pcdi_8) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cmpi_pcix_8) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cmpi_pcdi_16) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cmpi_pcix_16) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cmpi_pcdi_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cmpi_pcix_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cpbcc_16) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cpbcc_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cpdbcc) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cpgen) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cprestore) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cpsave) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cpscc) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cptrapcc_0) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cptrapcc_16) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_cptrapcc_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_divl) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_extb_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_link_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_mull) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_pack_rr) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_pack_mm) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_rtm) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_trapcc_0) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_trapcc_16) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_trapcc_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_tst_pcdi_8) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_tst_pcix_8) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_tst_i_8) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_tst_a_16) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_tst_pcdi_16) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_tst_pcix_16) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_tst_i_16) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_tst_a_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_tst_pcdi_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_tst_pcix_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_tst_i_32) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_unpk_rr) {
    cpu_type_local = 0;
  }
  else if (g_instruction_table[uVar1] == d68020_unpk_mm) {
    cpu_type_local = 0;
  }
  else {
switchD_004eebac_caseD_3:
    if (g_instruction_table[uVar1] == d68040_cinv) {
      cpu_type_local = 0;
    }
    else if (g_instruction_table[uVar1] == d68040_cpush) {
      cpu_type_local = 0;
    }
    else if (g_instruction_table[uVar1] == d68040_move16_pi_pi) {
      cpu_type_local = 0;
    }
    else if (g_instruction_table[uVar1] == d68040_move16_pi_al) {
      cpu_type_local = 0;
    }
    else if (g_instruction_table[uVar1] == d68040_move16_al_pi) {
      cpu_type_local = 0;
    }
    else if (g_instruction_table[uVar1] == d68040_move16_ai_al) {
      cpu_type_local = 0;
    }
    else if (g_instruction_table[uVar1] == d68040_move16_al_ai) {
      cpu_type_local = 0;
    }
    else {
switchD_004eebac_caseD_7:
      if (g_instruction_table[uVar1] == d68020_cpbcc_16) {
        cpu_type_local = 0;
      }
      else if (g_instruction_table[uVar1] == d68020_cpbcc_32) {
        cpu_type_local = 0;
      }
      else if (g_instruction_table[uVar1] == d68020_cpdbcc) {
        cpu_type_local = 0;
      }
      else if (g_instruction_table[uVar1] == d68020_cpgen) {
        cpu_type_local = 0;
      }
      else if (g_instruction_table[uVar1] == d68020_cprestore) {
        cpu_type_local = 0;
      }
      else if (g_instruction_table[uVar1] == d68020_cpsave) {
        cpu_type_local = 0;
      }
      else if (g_instruction_table[uVar1] == d68020_cpscc) {
        cpu_type_local = 0;
      }
      else if (g_instruction_table[uVar1] == d68020_cptrapcc_0) {
        cpu_type_local = 0;
      }
      else if (g_instruction_table[uVar1] == d68020_cptrapcc_16) {
        cpu_type_local = 0;
      }
      else if (g_instruction_table[uVar1] == d68020_cptrapcc_32) {
        cpu_type_local = 0;
      }
      else if (g_instruction_table[uVar1] == d68040_pflush) {
        cpu_type_local = 0;
      }
      else {
switchD_004eebac_default:
        if (((cpu_type == 4) || (cpu_type == 3)) ||
           ((g_instruction_table[uVar1] != d68020_callm &&
            (g_instruction_table[uVar1] != d68020_rtm)))) {
          cpu_type_local = 1;
        }
        else {
          cpu_type_local = 0;
        }
      }
    }
  }
  return cpu_type_local;
}

Assistant:

unsigned int m68k_is_valid_instruction(unsigned int instruction, unsigned int cpu_type)
{
	if(!g_initialized)
	{
		build_opcode_table();
		g_initialized = 1;
	}

	instruction &= 0xffff;
	if(g_instruction_table[instruction] == d68000_illegal)
		return 0;

	switch(cpu_type)
	{
		case M68K_CPU_TYPE_68000:
			if(g_instruction_table[instruction] == d68010_bkpt)
				return 0;
			if(g_instruction_table[instruction] == d68010_move_fr_ccr)
				return 0;
			if(g_instruction_table[instruction] == d68010_movec)
				return 0;
			if(g_instruction_table[instruction] == d68010_moves_8)
				return 0;
			if(g_instruction_table[instruction] == d68010_moves_16)
				return 0;
			if(g_instruction_table[instruction] == d68010_moves_32)
				return 0;
			if(g_instruction_table[instruction] == d68010_rtd)
				return 0;
			// Fallthrough
		case M68K_CPU_TYPE_68010:
			if(g_instruction_table[instruction] == d68020_bcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfchg)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfclr)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfexts)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfextu)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfffo)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfins)
				return 0;
			if(g_instruction_table[instruction] == d68020_bfset)
				return 0;
			if(g_instruction_table[instruction] == d68020_bftst)
				return 0;
			if(g_instruction_table[instruction] == d68020_bra_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_bsr_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_callm)
				return 0;
			if(g_instruction_table[instruction] == d68020_cas_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_cas_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cas_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cas2_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cas2_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_chk_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_chk2_cmp2_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_chk2_cmp2_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_chk2_cmp2_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcdi_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcix_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcdi_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcix_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcdi_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cmpi_pcix_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpbcc_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpbcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpdbcc)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpgen)
				return 0;
			if(g_instruction_table[instruction] == d68020_cprestore)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpsave)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpscc)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_0)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_divl)
				return 0;
			if(g_instruction_table[instruction] == d68020_extb_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_link_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_mull)
				return 0;
			if(g_instruction_table[instruction] == d68020_pack_rr)
				return 0;
			if(g_instruction_table[instruction] == d68020_pack_mm)
				return 0;
			if(g_instruction_table[instruction] == d68020_rtm)
				return 0;
			if(g_instruction_table[instruction] == d68020_trapcc_0)
				return 0;
			if(g_instruction_table[instruction] == d68020_trapcc_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_trapcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcdi_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcix_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_i_8)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_a_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcdi_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcix_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_i_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_a_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcdi_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_pcix_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_tst_i_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_unpk_rr)
				return 0;
			if(g_instruction_table[instruction] == d68020_unpk_mm)
				return 0;
			// Fallthrough
		case M68K_CPU_TYPE_68EC020:
		case M68K_CPU_TYPE_68020:
		case M68K_CPU_TYPE_68030:
		case M68K_CPU_TYPE_68EC030:
			if(g_instruction_table[instruction] == d68040_cinv)
				return 0;
			if(g_instruction_table[instruction] == d68040_cpush)
				return 0;
			if(g_instruction_table[instruction] == d68040_move16_pi_pi)
				return 0;
			if(g_instruction_table[instruction] == d68040_move16_pi_al)
				return 0;
			if(g_instruction_table[instruction] == d68040_move16_al_pi)
				return 0;
			if(g_instruction_table[instruction] == d68040_move16_ai_al)
				return 0;
			if(g_instruction_table[instruction] == d68040_move16_al_ai)
				return 0;
			// Fallthrough
		case M68K_CPU_TYPE_68040:
		case M68K_CPU_TYPE_68EC040:
		case M68K_CPU_TYPE_68LC040:
			if(g_instruction_table[instruction] == d68020_cpbcc_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpbcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpdbcc)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpgen)
				return 0;
			if(g_instruction_table[instruction] == d68020_cprestore)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpsave)
				return 0;
			if(g_instruction_table[instruction] == d68020_cpscc)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_0)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_16)
				return 0;
			if(g_instruction_table[instruction] == d68020_cptrapcc_32)
				return 0;
			if(g_instruction_table[instruction] == d68040_pflush)
				return 0;
	}
	if(cpu_type != M68K_CPU_TYPE_68020 && cpu_type != M68K_CPU_TYPE_68EC020 &&
	  (g_instruction_table[instruction] == d68020_callm ||
	  g_instruction_table[instruction] == d68020_rtm))
		return 0;

	return 1;
}